

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  Mat m_4;
  int z_;
  Mat borderm_1;
  int z;
  float pad_value_1;
  int q_1;
  int outd;
  Mat m_1;
  int q_;
  float pad_value;
  Mat borderm;
  int q;
  int outc;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  anon_union_4_2_947300b0 tmp_5;
  anon_union_4_2_947300b0 tmp_4;
  anon_union_4_2_947300b0 tmp_3;
  anon_union_4_2_947300b0 tmp_2;
  anon_union_4_2_947300b0 tmp_1;
  anon_union_4_2_947300b0 tmp;
  Mat *m_3;
  Mat *m;
  int i_3;
  char *ptr_3;
  int size_3;
  int i;
  char *ptr;
  int size;
  int i_4;
  unsigned_short *ptr_4;
  int size_4;
  int i_1;
  unsigned_short *ptr_1;
  int size_1;
  int i_5;
  float *ptr_5;
  int size_5;
  int i_2;
  float *ptr_2;
  int size_2;
  Mat *m_5;
  Mat *m_2;
  Allocator *in_stack_fffffffffffff638;
  Allocator *in_stack_fffffffffffff640;
  float **ppfVar3;
  size_t in_stack_fffffffffffff648;
  int _w;
  Mat *pMVar4;
  undefined4 in_stack_fffffffffffff650;
  undefined2 in_stack_fffffffffffff654;
  undefined2 in_stack_fffffffffffff656;
  int in_stack_fffffffffffff658;
  int in_stack_fffffffffffff65c;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  float in_stack_fffffffffffff668;
  int in_stack_fffffffffffff66c;
  undefined8 in_stack_fffffffffffff670;
  Mat *pMVar5;
  Mat *in_stack_fffffffffffff678;
  Mat *in_stack_fffffffffffff680;
  Mat *src;
  int local_960;
  int local_95c;
  unsigned_short local_954;
  Allocator *in_stack_fffffffffffff6b0;
  float local_91c;
  int local_8b4;
  int local_8b0;
  unsigned_short local_8a8;
  float local_8a4;
  Mat local_800;
  Mat local_7b8;
  int local_76c;
  undefined8 local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined4 local_750;
  long *local_748;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined8 local_728;
  float *local_720;
  int *local_718;
  long local_710;
  undefined4 local_708;
  long *local_700;
  undefined4 local_6f8;
  int local_6f4;
  int local_6f0;
  undefined4 local_6ec;
  int local_6e8;
  long local_6e0;
  int local_6d8;
  float local_6d4;
  int local_6d0;
  int local_6cc;
  void *local_6c8;
  int *local_6c0;
  ulong local_6b8;
  undefined4 local_6b0;
  long *local_6a8;
  int local_6a0;
  int local_69c;
  int local_698;
  undefined4 local_694;
  undefined4 local_690;
  ulong local_688;
  int local_680;
  float local_66c;
  float *local_668;
  int *local_660;
  ulong local_658;
  undefined4 local_650;
  long *local_648;
  int local_640;
  int local_63c;
  int local_638;
  undefined4 local_634;
  int local_630;
  ulong local_628;
  int local_620;
  int local_61c;
  int local_618;
  int local_614;
  long local_610;
  int local_604;
  int local_600;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  long local_5f0;
  long *local_5e8;
  long *local_5e0;
  int local_5cc;
  int local_5c8;
  undefined4 local_5c4;
  long *local_5c0;
  void **local_5a8;
  float **local_598;
  undefined8 *local_588;
  Mat *local_578;
  Mat *local_568;
  float **local_558;
  long *local_548;
  long *local_540;
  long *local_538;
  long *local_530;
  float local_528;
  float local_524;
  float local_520;
  float local_51c;
  float local_518;
  float local_514;
  float local_510;
  float local_50c;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined1 local_4f5;
  int local_4f4;
  undefined8 *local_4e8;
  undefined1 local_4d5;
  int local_4d4;
  float **local_4c8;
  long local_4b8;
  long *local_4b0;
  long local_4a8;
  long *local_4a0;
  int local_494;
  float *local_490;
  int local_488;
  undefined1 local_481;
  float **local_480;
  int local_474;
  float *local_470;
  int local_468;
  undefined1 local_461;
  float **local_460;
  int local_454;
  float *local_450;
  int local_448;
  unsigned_short local_442;
  float **local_440;
  int local_434;
  float *local_430;
  int local_428;
  unsigned_short local_422;
  float **local_420;
  int local_414;
  float *local_410;
  int local_408;
  float local_404;
  float **local_400;
  int local_3f4;
  float *local_3f0;
  int local_3e8;
  float local_3e4;
  float **local_3e0;
  undefined1 local_3d5;
  int local_3d4;
  Mat *local_3c8;
  undefined1 local_3b5;
  int local_3b4;
  void **local_3a8;
  int local_394;
  undefined8 *local_390;
  float **local_388;
  int local_37c;
  Mat *local_378;
  Mat *local_370;
  int local_318;
  undefined4 local_314;
  float **local_310;
  int local_2f8;
  undefined4 local_2f4;
  Mat *local_2f0;
  Mat *local_2d0;
  undefined8 *local_2b0;
  int local_298;
  undefined4 local_294;
  float **local_290;
  int local_278;
  undefined4 local_274;
  void **local_270;
  int local_268;
  undefined4 local_264;
  void *local_258;
  void *local_250;
  float *local_240;
  void *local_210;
  float *local_200;
  float **local_1d0;
  float **local_1c8;
  float **local_1c0;
  float **local_1b8;
  float **local_1b0;
  float **local_1a8;
  long *local_1a0;
  long *local_198;
  long *local_190;
  long *local_188;
  long *local_180;
  undefined4 local_174;
  ulong local_170;
  void *local_168;
  undefined4 local_15c;
  int local_158;
  int local_154;
  void **local_150;
  Allocator *local_148;
  int local_13c;
  size_t local_138;
  long local_130;
  undefined4 local_124;
  int local_120;
  int local_11c;
  Mat *local_118;
  long *local_110;
  undefined4 local_104;
  ulong local_100;
  float *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  float **local_e0;
  long *local_d8;
  undefined4 local_cc;
  long local_c8;
  long local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  Mat *local_38;
  long *local_30;
  undefined4 local_24;
  long local_20;
  float *local_18;
  int local_10;
  int local_c;
  float **local_8;
  
  if (((((*(int *)(in_RDI + 0xd0) == 0) && (*(int *)(in_RDI + 0xd4) == 0)) &&
       (*(int *)(in_RDI + 0xd8) == 0)) &&
      ((*(int *)(in_RDI + 0xdc) == 0 && (*(int *)(in_RDI + 0xe8) == 0)))) &&
     (*(int *)(in_RDI + 0xec) == 0)) {
    if (in_RDX != in_RSI) {
      if (in_RSI[1] != 0) {
        piVar1 = (int *)in_RSI[1];
        local_5c4 = 1;
        LOCK();
        local_5c8 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_5c0 = in_RSI;
      if (in_RDX[1] != 0) {
        piVar1 = (int *)in_RDX[1];
        local_264 = 0xffffffff;
        LOCK();
        local_268 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_268 == 1) {
          if (in_RDX[4] == 0) {
            local_258 = (void *)*in_RDX;
            if (local_258 != (void *)0x0) {
              free(local_258);
            }
          }
          else {
            (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
          }
        }
      }
      *in_RDX = 0;
      in_RDX[2] = 0;
      *(undefined4 *)(in_RDX + 3) = 0;
      *(undefined4 *)(in_RDX + 5) = 0;
      *(undefined4 *)((long)in_RDX + 0x2c) = 0;
      *(undefined4 *)(in_RDX + 6) = 0;
      *(undefined4 *)((long)in_RDX + 0x34) = 0;
      *(undefined4 *)(in_RDX + 7) = 0;
      in_RDX[8] = 0;
      in_RDX[1] = 0;
      *in_RDX = *local_5c0;
      in_RDX[1] = local_5c0[1];
      in_RDX[2] = local_5c0[2];
      *(int *)(in_RDX + 3) = (int)local_5c0[3];
      in_RDX[4] = local_5c0[4];
      *(int *)(in_RDX + 5) = (int)local_5c0[5];
      *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_5c0 + 0x2c);
      *(int *)(in_RDX + 6) = (int)local_5c0[6];
      *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_5c0 + 0x34);
      *(int *)(in_RDX + 7) = (int)local_5c0[7];
      in_RDX[8] = local_5c0[8];
    }
    local_5cc = 0;
  }
  else {
    local_5f4 = *(int *)((long)in_RSI + 0x2c);
    local_5f8 = (int)in_RSI[6];
    local_5fc = *(int *)((long)in_RSI + 0x34);
    local_600 = (int)in_RSI[7];
    local_604 = (int)in_RSI[5];
    local_610 = in_RSI[2];
    local_614 = local_5f4 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
    _w = (int)(in_stack_fffffffffffff648 >> 0x20);
    local_5f0 = in_RCX;
    local_5e8 = in_RDX;
    if (local_604 == 1) {
      Mat::create((Mat *)CONCAT26(in_stack_fffffffffffff656,
                                  CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)),_w,
                  (size_t)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      local_530 = local_5e8;
      bVar2 = true;
      if (*local_5e8 != 0) {
        local_1a0 = local_5e8;
        bVar2 = local_5e8[8] * (long)(int)local_5e8[7] == 0;
      }
      if (bVar2) {
        local_5cc = -100;
      }
      else {
        if (local_610 == 1) {
          copy_make_border_image<signed_char>
                    (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                     (int)((ulong)in_stack_fffffffffffff670 >> 0x20),(int)in_stack_fffffffffffff670,
                     in_stack_fffffffffffff66c,(char)((uint)in_stack_fffffffffffff668 >> 0x18));
        }
        if (local_610 == 2) {
          if (((*(byte *)(in_RDI + 0xd) & 1) == 0) || ((*(byte *)(local_5f0 + 0x22) & 1) == 0)) {
            local_500 = *(undefined4 *)(in_RDI + 0xe4);
            local_4fc = local_500;
          }
          else {
            float32_to_float16(*(float *)(in_RDI + 0xe4));
          }
          copy_make_border_image<unsigned_short>
                    (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                     (int)((ulong)in_stack_fffffffffffff670 >> 0x20),(int)in_stack_fffffffffffff670,
                     in_stack_fffffffffffff66c,
                     (unsigned_short)((uint)in_stack_fffffffffffff668 >> 0x10));
        }
        if (local_610 == 4) {
          copy_make_border_image<float>
                    (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                     (int)((ulong)in_stack_fffffffffffff670 >> 0x20),(int)in_stack_fffffffffffff670,
                     in_stack_fffffffffffff66c,in_stack_fffffffffffff668);
        }
        local_5cc = 0;
      }
    }
    else {
      local_618 = local_5f8 + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      if (local_604 == 2) {
        Mat::create((Mat *)CONCAT26(in_stack_fffffffffffff656,
                                    CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)),
                    _w,(int)in_stack_fffffffffffff648,(size_t)in_stack_fffffffffffff640,
                    in_stack_fffffffffffff638);
        local_538 = local_5e8;
        bVar2 = true;
        if (*local_5e8 != 0) {
          local_198 = local_5e8;
          bVar2 = local_5e8[8] * (long)(int)local_5e8[7] == 0;
        }
        if (bVar2) {
          local_5cc = -100;
        }
        else {
          if (local_610 == 1) {
            copy_make_border_image<signed_char>
                      (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                       (int)((ulong)in_stack_fffffffffffff670 >> 0x20),
                       (int)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
                       (char)((uint)in_stack_fffffffffffff668 >> 0x18));
          }
          if (local_610 == 2) {
            if (((*(byte *)(in_RDI + 0xd) & 1) == 0) || ((*(byte *)(local_5f0 + 0x22) & 1) == 0)) {
              local_508 = *(undefined4 *)(in_RDI + 0xe4);
              local_504 = local_508;
            }
            else {
              float32_to_float16(*(float *)(in_RDI + 0xe4));
            }
            copy_make_border_image<unsigned_short>
                      (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                       (int)((ulong)in_stack_fffffffffffff670 >> 0x20),
                       (int)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
                       (unsigned_short)((uint)in_stack_fffffffffffff668 >> 0x10));
          }
          if (local_610 == 4) {
            copy_make_border_image<float>
                      (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                       (int)((ulong)in_stack_fffffffffffff670 >> 0x20),
                       (int)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
                       in_stack_fffffffffffff668);
          }
          local_5cc = 0;
        }
      }
      else {
        local_5e0 = in_RSI;
        if (local_604 == 3) {
          local_61c = local_600 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                      in_stack_fffffffffffff65c,in_stack_fffffffffffff658,
                      CONCAT22(in_stack_fffffffffffff656,in_stack_fffffffffffff654),
                      in_stack_fffffffffffff648,in_stack_fffffffffffff640);
          local_540 = local_5e8;
          bVar2 = true;
          if (*local_5e8 != 0) {
            local_190 = local_5e8;
            bVar2 = local_5e8[8] * (long)(int)local_5e8[7] == 0;
          }
          if (bVar2) {
            local_5cc = -100;
          }
          else {
            for (local_620 = 0; local_620 < local_61c; local_620 = local_620 + 1) {
              local_4c8 = &local_668;
              local_e4 = *(int *)((long)local_5e8 + 0x2c);
              local_e8 = (int)local_5e8[6];
              local_ec = *(int *)((long)local_5e8 + 0x34);
              local_f8 = (float *)(*local_5e8 + local_5e8[8] * (long)local_620 * local_5e8[2]);
              local_100 = local_5e8[2];
              local_104 = (undefined4)local_5e8[3];
              local_110 = (long *)local_5e8[4];
              local_e0 = &local_668;
              local_660 = (int *)0x0;
              local_634 = 1;
              local_88 = (long)local_e4 * (long)local_e8 * local_100;
              local_628 = (local_88 + 0xfU & 0xfffffffffffffff0) / local_100;
              local_640 = (int)local_5e8[5] + -1;
              if ((int)local_5e8[5] == 4) {
                local_628 = (long)*(int *)((long)local_5e8 + 0x2c) * (long)(int)local_5e8[6];
              }
              local_8c = 0x10;
              local_4d4 = local_620;
              local_4d5 = 1;
              if (*(int *)(in_RDI + 0xf0) == 0) {
                local_8a4 = *(float *)(in_RDI + 0xe4);
              }
              else {
                local_4a0 = (long *)(in_RDI + 0xf8);
                local_4a8 = (long)local_620;
                local_8a4 = *(float *)(*local_4a0 + local_4a8 * 4);
              }
              local_66c = local_8a4;
              local_668 = local_f8;
              local_658 = local_100;
              local_650 = local_104;
              local_648 = local_110;
              local_63c = local_e4;
              local_638 = local_e8;
              local_630 = local_ec;
              if (((local_620 < *(int *)(in_RDI + 0xe8)) ||
                  (local_600 + *(int *)(in_RDI + 0xe8) <= local_620)) &&
                 (*(int *)(in_RDI + 0xe0) == 0)) {
                if (local_610 == 1) {
                  local_460 = &local_668;
                  local_461 = (undefined1)(int)local_8a4;
                  local_468 = (int)local_628 * local_ec;
                  for (local_474 = 0; local_470 = local_f8, local_1b0 = local_460,
                      local_474 < local_468; local_474 = local_474 + 1) {
                    *(undefined1 *)((long)local_f8 + (long)local_474) = local_461;
                  }
                }
                if (local_610 == 2) {
                  if (((*(byte *)(in_RDI + 0xd) & 1) == 0) ||
                     ((*(byte *)(local_5f0 + 0x22) & 1) == 0)) {
                    local_50c = local_8a4;
                    local_510 = local_8a4;
                    local_8a8 = (unsigned_short)((uint)local_8a4 >> 0x10);
                  }
                  else {
                    local_8a8 = float32_to_float16(local_8a4);
                  }
                  local_420 = &local_668;
                  local_422 = local_8a8;
                  local_428 = (int)local_628 * local_630;
                  local_430 = local_668;
                  for (local_434 = 0; local_1c0 = local_420, local_434 < local_428;
                      local_434 = local_434 + 1) {
                    *(unsigned_short *)((long)local_668 + (long)local_434 * 2) = local_8a8;
                  }
                }
                if (local_610 == 4) {
                  local_3e0 = &local_668;
                  local_3e4 = local_66c;
                  local_3e8 = (int)local_628 * local_630;
                  local_3f0 = local_668;
                  for (local_3f4 = 0; local_1d0 = local_3e0, local_3f4 < local_3e8;
                      local_3f4 = local_3f4 + 1) {
                    *local_3f0 = local_66c;
                    local_3f0 = local_3f0 + 1;
                  }
                }
              }
              else {
                local_8b0 = local_620 - *(int *)(in_RDI + 0xe8);
                local_680 = local_8b0;
                if (*(int *)(in_RDI + 0xe0) == 1) {
                  if (local_8b0 < 1) {
                    local_8b0 = 0;
                  }
                  if (local_8b0 < local_600 + -1) {
                    local_8b4 = local_8b0;
                  }
                  else {
                    local_8b4 = local_600 + -1;
                  }
                  local_680 = local_8b4;
                }
                if (*(int *)(in_RDI + 0xe0) == 2) {
                  if (local_680 < 1) {
                    local_680 = -local_680;
                  }
                  local_680 = local_680 - (local_600 + -1);
                  if (local_680 < 1) {
                    local_680 = -local_680;
                  }
                  local_680 = (local_600 + -1) - local_680;
                }
                local_3a8 = &local_6c8;
                local_154 = *(int *)((long)local_5e0 + 0x2c);
                local_158 = (int)local_5e0[6];
                local_15c = *(undefined4 *)((long)local_5e0 + 0x34);
                local_168 = (void *)(*local_5e0 + local_5e0[8] * (long)local_680 * local_5e0[2]);
                local_170 = local_5e0[2];
                local_174 = (undefined4)local_5e0[3];
                local_180 = (long *)local_5e0[4];
                local_150 = &local_6c8;
                local_6c0 = (int *)0x0;
                local_694 = 1;
                local_68 = (long)local_154 * (long)local_158 * local_170;
                local_688 = (local_68 + 0xfU & 0xfffffffffffffff0) / local_170;
                local_6a0 = (int)local_5e0[5] + -1;
                if ((int)local_5e0[5] == 4) {
                  local_688 = (long)*(int *)((long)local_5e0 + 0x2c) * (long)(int)local_5e0[6];
                }
                local_6c = 0x10;
                local_8c = 0x10;
                local_3b4 = local_680;
                local_3b5 = 1;
                local_4d5 = 1;
                local_6c8 = local_168;
                local_6b8 = local_170;
                local_6b0 = local_174;
                local_6a8 = local_180;
                local_69c = local_154;
                local_698 = local_158;
                local_690 = local_15c;
                if (local_610 == 1) {
                  copy_make_border_image<signed_char>
                            (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                             (int)((ulong)in_stack_fffffffffffff670 >> 0x20),
                             (int)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
                             (char)((uint)in_stack_fffffffffffff668 >> 0x18));
                }
                if (local_610 == 2) {
                  if (((*(byte *)(in_RDI + 0xd) & 1) == 0) ||
                     ((*(byte *)(local_5f0 + 0x22) & 1) == 0)) {
                    local_514 = local_66c;
                    local_518 = local_66c;
                  }
                  else {
                    float32_to_float16(local_66c);
                  }
                  copy_make_border_image<unsigned_short>
                            (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                             (int)((ulong)in_stack_fffffffffffff670 >> 0x20),
                             (int)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
                             (unsigned_short)((uint)in_stack_fffffffffffff668 >> 0x10));
                }
                if (local_610 == 4) {
                  copy_make_border_image<float>
                            (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                             (int)((ulong)in_stack_fffffffffffff670 >> 0x20),
                             (int)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
                             in_stack_fffffffffffff668);
                }
                local_5a8 = &local_6c8;
                local_270 = local_5a8;
                if (local_6c0 != (int *)0x0) {
                  local_274 = 0xffffffff;
                  LOCK();
                  local_278 = *local_6c0;
                  *local_6c0 = *local_6c0 + -1;
                  UNLOCK();
                  if (local_278 == 1) {
                    if (local_6a8 == (long *)0x0) {
                      local_250 = local_6c8;
                      if (local_6c8 != (void *)0x0) {
                        free(local_6c8);
                      }
                    }
                    else {
                      (**(code **)(*local_6a8 + 0x18))(local_6a8,local_6c8);
                    }
                  }
                }
                local_6c8 = (void *)0x0;
                local_6b8 = 0;
                local_6b0 = 0;
                local_6a0 = 0;
                local_69c = 0;
                local_698 = 0;
                local_694 = 0;
                local_690 = 0;
                local_688 = 0;
                local_6c0 = (int *)0x0;
              }
              local_598 = &local_668;
              local_290 = local_598;
              if (local_660 != (int *)0x0) {
                local_294 = 0xffffffff;
                LOCK();
                local_298 = *local_660;
                *local_660 = *local_660 + -1;
                UNLOCK();
                if (local_298 == 1) {
                  if (local_648 == (long *)0x0) {
                    local_240 = local_668;
                    if (local_668 != (float *)0x0) {
                      free(local_668);
                    }
                  }
                  else {
                    (**(code **)(*local_648 + 0x18))(local_648,local_668);
                  }
                }
              }
            }
            local_5cc = 0;
          }
        }
        else if (local_604 == 4) {
          local_6cc = local_5fc + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
          Mat::create((Mat *)CONCAT26(in_stack_fffffffffffff656,
                                      CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))
                      ,_w,(int)in_stack_fffffffffffff648,
                      (int)((ulong)in_stack_fffffffffffff640 >> 0x20),(int)in_stack_fffffffffffff640
                      ,(size_t)in_stack_fffffffffffff638,in_stack_fffffffffffff6b0);
          local_548 = local_5e8;
          bVar2 = true;
          if (*local_5e8 != 0) {
            local_188 = local_5e8;
            bVar2 = local_5e8[8] * (long)(int)local_5e8[7] == 0;
          }
          if (bVar2) {
            local_5cc = -100;
          }
          else {
            for (local_6d0 = 0; local_6d0 < local_600; local_6d0 = local_6d0 + 1) {
              if (*(int *)(in_RDI + 0xf0) == 0) {
                local_91c = *(float *)(in_RDI + 0xe4);
              }
              else {
                local_4b0 = (long *)(in_RDI + 0xf8);
                local_4b8 = (long)local_6d0;
                local_91c = *(float *)(*local_4b0 + local_4b8 * 4);
              }
              local_6d4 = local_91c;
              for (local_6d8 = 0; local_6d8 < local_6cc; local_6d8 = local_6d8 + 1) {
                local_4e8 = &local_768;
                local_ac = *(int *)((long)local_5e8 + 0x2c);
                local_b0 = (int)local_5e8[6];
                local_b4 = *(undefined4 *)((long)local_5e8 + 0x34);
                local_c0 = *local_5e8 + local_5e8[8] * (long)local_6d0 * local_5e8[2];
                local_c8 = local_5e8[2];
                local_cc = (undefined4)local_5e8[3];
                local_d8 = (long *)local_5e8[4];
                local_a8 = &local_768;
                local_98 = (long)local_ac * (long)local_b0 * local_c8;
                local_388 = &local_720;
                local_390 = &local_768;
                local_18 = (float *)(local_c0 +
                                    (long)local_ac * (long)local_b0 * (long)local_6d8 * local_c8);
                local_8 = &local_720;
                local_6e0 = (long)local_ac * (long)local_b0;
                local_588 = &local_768;
                local_6e8 = 1;
                local_6ec = 1;
                local_6f8 = 2;
                local_718 = (int *)0x0;
                local_9c = 0x10;
                local_394 = local_6d8;
                local_4f4 = local_6d0;
                local_4f5 = 1;
                local_768 = 0;
                local_758 = 0;
                local_750 = 0;
                local_740 = 0;
                local_73c = 0;
                local_738 = 0;
                local_734 = 0;
                local_730 = 0;
                local_728 = 0;
                local_760 = 0;
                local_2b0 = local_588;
                local_30 = local_d8;
                local_24 = local_cc;
                local_20 = local_c8;
                local_10 = local_b0;
                local_c = local_ac;
                local_748 = local_d8;
                local_720 = local_18;
                local_710 = local_c8;
                local_708 = local_cc;
                local_700 = local_d8;
                local_6f4 = local_ac;
                local_6f0 = local_b0;
                if (((local_6d8 < *(int *)(in_RDI + 0xe8)) ||
                    (local_5fc + *(int *)(in_RDI + 0xe8) <= local_6d8)) &&
                   (*(int *)(in_RDI + 0xe0) == 0)) {
                  if (local_610 == 1) {
                    local_480 = &local_720;
                    local_481 = (undefined1)(int)local_6d4;
                    local_488 = (int)local_6e0;
                    for (local_494 = 0; local_490 = local_18, local_1a8 = local_480,
                        local_494 < local_488; local_494 = local_494 + 1) {
                      *(undefined1 *)((long)local_18 + (long)local_494) = local_481;
                    }
                  }
                  if (local_610 == 2) {
                    if (((*(byte *)(in_RDI + 0xd) & 1) == 0) ||
                       ((*(byte *)(local_5f0 + 0x22) & 1) == 0)) {
                      local_51c = local_6d4;
                      local_520 = local_6d4;
                      local_954 = (unsigned_short)((uint)local_6d4 >> 0x10);
                    }
                    else {
                      local_954 = float32_to_float16(local_6d4);
                    }
                    local_440 = &local_720;
                    local_442 = local_954;
                    local_448 = (int)local_6e0 * local_6e8;
                    local_450 = local_720;
                    for (local_454 = 0; local_1b8 = local_440, local_454 < local_448;
                        local_454 = local_454 + 1) {
                      *(unsigned_short *)((long)local_720 + (long)local_454 * 2) = local_954;
                    }
                  }
                  if (local_610 == 4) {
                    local_400 = &local_720;
                    local_404 = local_6d4;
                    local_408 = (int)local_6e0 * local_6e8;
                    local_410 = local_720;
                    for (local_414 = 0; local_1c8 = local_400, local_414 < local_408;
                        local_414 = local_414 + 1) {
                      *local_410 = local_6d4;
                      local_410 = local_410 + 1;
                    }
                  }
                }
                else {
                  local_95c = local_6d8 - *(int *)(in_RDI + 0xe8);
                  local_76c = local_95c;
                  if (*(int *)(in_RDI + 0xe0) == 1) {
                    if (local_95c < 1) {
                      local_95c = 0;
                    }
                    if (local_95c < local_5fc + -1) {
                      local_960 = local_95c;
                    }
                    else {
                      local_960 = local_5fc + -1;
                    }
                    local_76c = local_960;
                  }
                  if (*(int *)(in_RDI + 0xe0) == 2) {
                    if (local_76c < 1) {
                      local_76c = -local_76c;
                    }
                    local_76c = local_76c - (local_5fc + -1);
                    if (local_76c < 1) {
                      local_76c = -local_76c;
                    }
                    local_76c = (local_5fc + -1) - local_76c;
                  }
                  local_3c8 = &local_800;
                  local_11c = *(int *)((long)local_5e0 + 0x2c);
                  local_120 = (int)local_5e0[6];
                  local_124 = *(undefined4 *)((long)local_5e0 + 0x34);
                  local_130 = *local_5e0 + local_5e0[8] * (long)local_6d0 * local_5e0[2];
                  local_138 = local_5e0[2];
                  local_13c = (int)local_5e0[3];
                  local_148 = (Allocator *)local_5e0[4];
                  local_118 = &local_800;
                  local_78 = (long)local_11c * (long)local_120 * local_138;
                  local_370 = &local_7b8;
                  pMVar4 = &local_800;
                  local_48 = (void *)(local_130 +
                                     (long)local_11c * (long)local_120 * (long)local_76c * local_138
                                     );
                  src = &local_7b8;
                  local_7b8.cstep = (long)local_11c * (long)local_120;
                  pMVar5 = &local_800;
                  local_7b8.c = 1;
                  local_7b8.d = 1;
                  local_7b8.dims = 2;
                  local_7b8.refcount = (int *)0x0;
                  local_7c = 0x10;
                  local_37c = local_76c;
                  local_3d4 = local_6d0;
                  local_3d5 = 1;
                  local_800.data = (void *)0x0;
                  local_800.elemsize = 0;
                  local_800.elempack = 0;
                  local_800.dims = 0;
                  local_800.w = 0;
                  local_800.h = 0;
                  local_800.d = 0;
                  local_800.c = 0;
                  local_800.cstep = 0;
                  local_800.refcount = (int *)0x0;
                  local_578 = pMVar5;
                  local_378 = pMVar4;
                  local_2d0 = pMVar5;
                  local_60 = local_148;
                  local_54 = local_13c;
                  local_50 = local_138;
                  local_40 = local_120;
                  local_3c = local_11c;
                  local_38 = src;
                  local_800.allocator = local_148;
                  local_7b8.data = local_48;
                  local_7b8.elemsize = local_138;
                  local_7b8.elempack = local_13c;
                  local_7b8.allocator = local_148;
                  local_7b8.w = local_11c;
                  local_7b8.h = local_120;
                  if (local_610 == 1) {
                    copy_make_border_image<signed_char>
                              (src,pMVar4,(int)((ulong)pMVar5 >> 0x20),(int)pMVar5,
                               in_stack_fffffffffffff66c,
                               (char)((uint)in_stack_fffffffffffff668 >> 0x18));
                  }
                  if (local_610 == 2) {
                    if (((*(byte *)(in_RDI + 0xd) & 1) == 0) ||
                       ((*(byte *)(local_5f0 + 0x22) & 1) == 0)) {
                      local_524 = local_6d4;
                      local_528 = local_6d4;
                    }
                    else {
                      float32_to_float16(local_6d4);
                    }
                    copy_make_border_image<unsigned_short>
                              (src,pMVar4,(int)((ulong)pMVar5 >> 0x20),(int)pMVar5,
                               in_stack_fffffffffffff66c,
                               (unsigned_short)((uint)in_stack_fffffffffffff668 >> 0x10));
                  }
                  if (local_610 == 4) {
                    copy_make_border_image<float>
                              (src,pMVar4,(int)((ulong)pMVar5 >> 0x20),(int)pMVar5,
                               in_stack_fffffffffffff66c,in_stack_fffffffffffff668);
                  }
                  pMVar4 = &local_7b8;
                  local_568 = pMVar4;
                  local_2f0 = pMVar4;
                  if (local_7b8.refcount != (int *)0x0) {
                    local_2f4 = 0xffffffff;
                    LOCK();
                    local_2f8 = *local_7b8.refcount;
                    *local_7b8.refcount = *local_7b8.refcount + -1;
                    UNLOCK();
                    if (local_2f8 == 1) {
                      if (local_7b8.allocator == (Allocator *)0x0) {
                        local_210 = local_7b8.data;
                        if (local_7b8.data != (void *)0x0) {
                          free(local_7b8.data);
                        }
                      }
                      else {
                        (*(local_7b8.allocator)->_vptr_Allocator[3])
                                  (local_7b8.allocator,local_7b8.data);
                      }
                    }
                  }
                  pMVar4->data = (void *)0x0;
                  pMVar4->elemsize = 0;
                  pMVar4->elempack = 0;
                  pMVar4->dims = 0;
                  pMVar4->w = 0;
                  pMVar4->h = 0;
                  pMVar4->d = 0;
                  pMVar4->c = 0;
                  pMVar4->cstep = 0;
                  pMVar4->refcount = (int *)0x0;
                }
                ppfVar3 = &local_720;
                local_558 = ppfVar3;
                local_310 = ppfVar3;
                if (local_718 != (int *)0x0) {
                  local_314 = 0xffffffff;
                  LOCK();
                  local_318 = *local_718;
                  *local_718 = *local_718 + -1;
                  UNLOCK();
                  if (local_318 == 1) {
                    if (local_700 == (long *)0x0) {
                      local_200 = local_720;
                      if (local_720 != (float *)0x0) {
                        free(local_720);
                      }
                    }
                    else {
                      (**(code **)(*local_700 + 0x18))(local_700,local_720);
                    }
                  }
                }
                *ppfVar3 = (float *)0x0;
                ppfVar3[2] = (float *)0x0;
                *(undefined4 *)(ppfVar3 + 3) = 0;
                *(undefined4 *)(ppfVar3 + 5) = 0;
                *(undefined4 *)((long)ppfVar3 + 0x2c) = 0;
                *(undefined4 *)(ppfVar3 + 6) = 0;
                *(undefined4 *)((long)ppfVar3 + 0x34) = 0;
                *(undefined4 *)(ppfVar3 + 7) = 0;
                ppfVar3[8] = (float *)0x0;
                ppfVar3[1] = (float *)0x0;
              }
            }
            local_5cc = 0;
          }
        }
        else {
          local_5cc = 0;
        }
      }
    }
  }
  return local_5cc;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, 0, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(value) : float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(value) : float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        int outc = channels + front + behind;

        top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat borderm = top_blob.channel(q);

            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            //Channel padding
            if (((q < front) || (q >= (channels + front))) && type == 0)
            {
                if (elemsize == 1)
                {
                    borderm.fill(static_cast<signed char>(pad_value));
                }
                if (elemsize == 2)
                {
                    borderm.fill(support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                }
                if (elemsize == 4)
                {
                    borderm.fill(pad_value);
                }
            }
            else
            {
                int q_ = q - front;

                if (type == 1)
                {
                    q_ = q_ <= 0 ? 0 : q_;
                    q_ = q_ >= channels - 1 ? channels - 1 : q_;
                }
                if (type == 2)
                {
                    q_ = abs(q_);
                    q_ = (channels - 1) - abs(q_ - (channels - 1));
                }
                const Mat m = bottom_blob.channel(q_);
                if (elemsize == 1)
                    copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
                if (elemsize == 2)
                    copy_make_border_image<unsigned short>(m, borderm, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                if (elemsize == 4)
                    copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outd = d + front + behind;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            for (int z = 0; z < outd; z++)
            {
                Mat borderm = top_blob.channel(q).depth(z);

                // depth padding
                if (((z < front) || (z >= (d + front))) && type == 0)
                {
                    if (elemsize == 1)
                    {
                        borderm.fill(static_cast<signed char>(pad_value));
                    }
                    if (elemsize == 2)
                    {
                        borderm.fill(support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                    }
                    if (elemsize == 4)
                    {
                        borderm.fill(pad_value);
                    }
                }
                else
                {
                    int z_ = z - front;

                    if (type == 1)
                    {
                        z_ = z_ <= 0 ? 0 : z_;
                        z_ = z_ >= d - 1 ? d - 1 : z_;
                    }
                    if (type == 2)
                    {
                        z_ = abs(z_);
                        z_ = (d - 1) - abs(z_ - (d - 1));
                    }
                    const Mat m = bottom_blob.channel(q).depth(z_);
                    if (elemsize == 1)
                        copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
                    if (elemsize == 2)
                        copy_make_border_image<unsigned short>(m, borderm, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                    if (elemsize == 4)
                        copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
                }
            }
        }

        return 0;
    }

    return 0;
}